

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stunmsg_unittest.cc
# Opt level: O2

void __thiscall StunMsg_RFC5769SampleRequest_Test::TestBody(StunMsg_RFC5769SampleRequest_Test *this)

{
  uint16_t uVar1;
  int iVar2;
  uint32_t uVar3;
  stun_attr_varsize *psVar4;
  void *pvVar5;
  stun_attr_uint32 *attr;
  stun_attr_uint64 *attr_00;
  stun_attr_msgint *msgint;
  stun_attr_hdr *psVar6;
  long lVar7;
  uint8_t *puVar8;
  uint8_t *puVar9;
  char *pcVar10;
  char *in_R9;
  AssertHelper local_1a8;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  AssertHelper local_170;
  char username [10];
  uint8_t tsx_id [12];
  char software_name [17];
  char password [23];
  uint8_t expected_result [108];
  uint8_t buffer [108];
  
  builtin_strncpy(software_name,"STUN test client",0x11);
  builtin_strncpy(username,"evtj:h6vY",10);
  builtin_strncpy(password,"VOkJxbRl1RmTxUk/WvJxBt",0x17);
  puVar8 = "";
  puVar9 = expected_result;
  for (lVar7 = 0x6c; lVar7 != 0; lVar7 = lVar7 + -1) {
    *puVar9 = *puVar8;
    puVar8 = puVar8 + 1;
    puVar9 = puVar9 + 1;
  }
  tsx_id[0] = 0xb7;
  tsx_id[1] = 0xe7;
  tsx_id[2] = 0xa7;
  tsx_id[3] = '\x01';
  tsx_id[4] = 0xbc;
  tsx_id[5] = '4';
  tsx_id[6] = 0xd6;
  tsx_id[7] = 0x86;
  tsx_id[8] = 0xfa;
  tsx_id[9] = 0x87;
  tsx_id[10] = 0xdf;
  tsx_id[0xb] = 0xae;
  gtest_ar_.success_ = true;
  gtest_ar_._1_7_ = 0;
  local_1a8.data_ = (AssertHelperData *)0x6c;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"sizeof(expected_result)","sizeof(buffer)",
             (unsigned_long *)&gtest_ar_,(unsigned_long *)&local_1a8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
               ,0xa0,pcVar10);
    testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&gtest_ar_);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    gtest_ar_._0_4_ = 1;
    iVar2 = stun_msg_verify((stun_msg_hdr *)expected_result,0x6c);
    local_1a8.data_._0_4_ = iVar2;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"1",
               "stun_msg_verify((stun_msg_hdr*)expected_result, sizeof(expected_result))",
               (int *)&gtest_ar_,(int *)&local_1a8);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar10 = "";
      }
      else {
        pcVar10 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                 ,0xa2,pcVar10);
      testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&gtest_ar_);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      stun_msg_hdr_init((stun_msg_hdr *)buffer,1,tsx_id);
      stun_attr_varsize_add((stun_msg_hdr *)buffer,0x8022,software_name,0x10,' ');
      stun_attr_uint32_add((stun_msg_hdr *)buffer,0x24,0x6e0001ff);
      stun_attr_uint64_add((stun_msg_hdr *)buffer,0x8029,0x932ff9b151263b36);
      stun_attr_varsize_add((stun_msg_hdr *)buffer,6,username,9,' ');
      stun_attr_msgint_add((stun_msg_hdr *)buffer,password,0x16);
      stun_attr_fingerprint_add((stun_msg_hdr *)buffer);
      anon_unknown.dwarf_6ced::IsEqual
                ((anon_unknown_dwarf_6ced *)&gtest_ar_,expected_result,(stun_msg_hdr *)buffer,0x6c);
      if (gtest_ar_.success_ == false) {
        testing::Message::Message((Message *)&local_1a8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)&gtest_ar_,
                   (AssertionResult *)"IsEqual(expected_result, buffer, sizeof(expected_result))",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_170,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                   ,0xb0,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
        testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_1a8);
        testing::internal::AssertHelper::~AssertHelper(&local_170);
        std::__cxx11::string::~string((string *)&gtest_ar);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_1a8);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_.message_);
      gtest_ar_._0_4_ = 1;
      uVar1 = stun_msg_type((stun_msg_hdr *)expected_result);
      local_1a8.data_._0_2_ = uVar1;
      testing::internal::CmpHelperEQ<stun_msg_type,unsigned_short>
                ((internal *)&gtest_ar,"STUN_BINDING_REQUEST","stun_msg_type(msg_hdr)",
                 (stun_msg_type *)&gtest_ar_,(unsigned_short *)&local_1a8);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar10 = "";
        }
        else {
          pcVar10 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_1a8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                   ,0xb4,pcVar10);
        testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper(&local_1a8);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar_);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      gtest_ar_.success_ = true;
      gtest_ar_._1_7_ = 0;
      local_1a8.data_ = (AssertHelperData *)stun_msg_len((stun_msg_hdr *)expected_result);
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&gtest_ar,"sizeof(expected_result)","stun_msg_len(msg_hdr)",
                 (unsigned_long *)&gtest_ar_,(unsigned_long *)&local_1a8);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar10 = "";
        }
        else {
          pcVar10 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_1a8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                   ,0xb5,pcVar10);
        testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper(&local_1a8);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar_);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      psVar4 = (stun_attr_varsize *)
               stun_msg_next_attr((stun_msg_hdr *)expected_result,(stun_attr_hdr *)0x0);
      gtest_ar_._0_4_ = 0x8022;
      uVar1 = stun_attr_type((stun_attr_hdr *)psVar4);
      local_1a8.data_._0_2_ = uVar1;
      testing::internal::CmpHelperEQ<stun_attr_type,unsigned_short>
                ((internal *)&gtest_ar,"STUN_ATTR_SOFTWARE","stun_attr_type(attr_hdr)",
                 (stun_attr_type *)&gtest_ar_,(unsigned_short *)&local_1a8);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar10 = "";
        }
        else {
          pcVar10 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_1a8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                   ,0xb8,pcVar10);
        testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper(&local_1a8);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar_);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      gtest_ar_.success_ = true;
      gtest_ar_._1_7_ = 0;
      local_1a8.data_ = (AssertHelperData *)stun_attr_len((stun_attr_hdr *)psVar4);
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&gtest_ar,"sizeof(software_name)-1","stun_attr_len(attr_hdr)",
                 (unsigned_long *)&gtest_ar_,(unsigned_long *)&local_1a8);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar10 = "";
        }
        else {
          pcVar10 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_1a8,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                   ,0xb9,pcVar10);
        testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&gtest_ar_);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        pvVar5 = stun_attr_varsize_read(psVar4);
        anon_unknown.dwarf_6ced::IsEqual
                  ((anon_unknown_dwarf_6ced *)&gtest_ar_,pvVar5,software_name,0x10);
        if (gtest_ar_.success_ == false) {
          testing::Message::Message((Message *)&local_1a8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar,(internal *)&gtest_ar_,
                     (AssertionResult *)"IsEqual(data, software_name, sizeof(software_name)-1)",
                     "false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_170,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,0xbc,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
          testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_1a8);
          testing::internal::AssertHelper::~AssertHelper(&local_170);
          std::__cxx11::string::~string((string *)&gtest_ar);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_1a8);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar_.message_);
        attr = (stun_attr_uint32 *)
               stun_msg_next_attr((stun_msg_hdr *)expected_result,(stun_attr_hdr *)psVar4);
        gtest_ar_._0_4_ = 0x24;
        uVar1 = stun_attr_type((stun_attr_hdr *)attr);
        local_1a8.data_._0_2_ = uVar1;
        testing::internal::CmpHelperEQ<stun_attr_type,unsigned_short>
                  ((internal *)&gtest_ar,"STUN_ATTR_PRIORITY","stun_attr_type(attr_hdr)",
                   (stun_attr_type *)&gtest_ar_,(unsigned_short *)&local_1a8);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar_);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar10 = "";
          }
          else {
            pcVar10 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_1a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,0xbf,pcVar10);
          testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&gtest_ar_);
          testing::internal::AssertHelper::~AssertHelper(&local_1a8);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&gtest_ar_);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        gtest_ar_.success_ = true;
        gtest_ar_._1_7_ = 0x6e0001;
        uVar3 = stun_attr_uint32_read(attr);
        local_1a8.data_._0_4_ = uVar3;
        testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
                  ((internal *)&gtest_ar,"0x6e0001fful",
                   "stun_attr_uint32_read((stun_attr_uint32*)attr_hdr)",(unsigned_long *)&gtest_ar_,
                   (uint *)&local_1a8);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar_);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar10 = "";
          }
          else {
            pcVar10 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_1a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,0xc0,pcVar10);
          testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&gtest_ar_);
          testing::internal::AssertHelper::~AssertHelper(&local_1a8);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&gtest_ar_);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        attr_00 = (stun_attr_uint64 *)
                  stun_msg_next_attr((stun_msg_hdr *)expected_result,(stun_attr_hdr *)attr);
        gtest_ar_._0_4_ = 0x8029;
        uVar1 = stun_attr_type((stun_attr_hdr *)attr_00);
        local_1a8.data_._0_2_ = uVar1;
        testing::internal::CmpHelperEQ<stun_attr_type,unsigned_short>
                  ((internal *)&gtest_ar,"STUN_ATTR_ICE_CONTROLLED","stun_attr_type(attr_hdr)",
                   (stun_attr_type *)&gtest_ar_,(unsigned_short *)&local_1a8);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar_);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar10 = "";
          }
          else {
            pcVar10 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_1a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,0xc3,pcVar10);
          testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&gtest_ar_);
          testing::internal::AssertHelper::~AssertHelper(&local_1a8);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&gtest_ar_);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        gtest_ar_.success_ = true;
        gtest_ar_._1_7_ = 0x932ff9b151263b;
        local_1a8.data_ = (AssertHelperData *)stun_attr_uint64_read(attr_00);
        testing::internal::CmpHelperEQ<unsigned_long_long,unsigned_long>
                  ((internal *)&gtest_ar,"0x932ff9b151263b36ull",
                   "stun_attr_uint64_read((stun_attr_uint64*)attr_hdr)",
                   (unsigned_long_long *)&gtest_ar_,(unsigned_long *)&local_1a8);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar_);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar10 = "";
          }
          else {
            pcVar10 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_1a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,0xc5,pcVar10);
          testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&gtest_ar_);
          testing::internal::AssertHelper::~AssertHelper(&local_1a8);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&gtest_ar_);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        psVar4 = (stun_attr_varsize *)
                 stun_msg_next_attr((stun_msg_hdr *)expected_result,(stun_attr_hdr *)attr_00);
        gtest_ar_._0_4_ = 6;
        uVar1 = stun_attr_type((stun_attr_hdr *)psVar4);
        local_1a8.data_._0_2_ = uVar1;
        testing::internal::CmpHelperEQ<stun_attr_type,unsigned_short>
                  ((internal *)&gtest_ar,"STUN_ATTR_USERNAME","stun_attr_type(attr_hdr)",
                   (stun_attr_type *)&gtest_ar_,(unsigned_short *)&local_1a8);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar_);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar10 = "";
          }
          else {
            pcVar10 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_1a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,200,pcVar10);
          testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&gtest_ar_);
          testing::internal::AssertHelper::~AssertHelper(&local_1a8);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&gtest_ar_);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        gtest_ar_.success_ = true;
        gtest_ar_._1_7_ = 0;
        local_1a8.data_ = (AssertHelperData *)stun_attr_len((stun_attr_hdr *)psVar4);
        testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                  ((internal *)&gtest_ar,"sizeof(username)-1","stun_attr_len(attr_hdr)",
                   (unsigned_long *)&gtest_ar_,(unsigned_long *)&local_1a8);
        if (gtest_ar.success_ != false) {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar.message_);
          pvVar5 = stun_attr_varsize_read(psVar4);
          anon_unknown.dwarf_6ced::IsEqual((anon_unknown_dwarf_6ced *)&gtest_ar_,pvVar5,username,9);
          if (gtest_ar_.success_ == false) {
            testing::Message::Message((Message *)&local_1a8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar,(internal *)&gtest_ar_,
                       (AssertionResult *)"IsEqual(data, username, sizeof(username)-1)","false",
                       "true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_170,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                       ,0xcb,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
            testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_1a8);
            testing::internal::AssertHelper::~AssertHelper(&local_170);
            std::__cxx11::string::~string((string *)&gtest_ar);
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_1a8);
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar_.message_);
          msgint = (stun_attr_msgint *)
                   stun_msg_next_attr((stun_msg_hdr *)expected_result,(stun_attr_hdr *)psVar4);
          gtest_ar_._0_4_ = 8;
          uVar1 = stun_attr_type((stun_attr_hdr *)msgint);
          local_1a8.data_._0_2_ = uVar1;
          testing::internal::CmpHelperEQ<stun_attr_type,unsigned_short>
                    ((internal *)&gtest_ar,"STUN_ATTR_MESSAGE_INTEGRITY","stun_attr_type(attr_hdr)",
                     (stun_attr_type *)&gtest_ar_,(unsigned_short *)&local_1a8);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar_);
            if (gtest_ar.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar10 = "";
            }
            else {
              pcVar10 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_1a8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                       ,0xce,pcVar10);
            testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&gtest_ar_);
            testing::internal::AssertHelper::~AssertHelper(&local_1a8);
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&gtest_ar_);
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar.message_);
          gtest_ar_._0_4_ = 1;
          iVar2 = stun_attr_msgint_check
                            (msgint,(stun_msg_hdr *)expected_result,(uint8_t *)password,0x16);
          local_1a8.data_._0_4_ = iVar2;
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)&gtest_ar,"1",
                     "stun_attr_msgint_check((stun_attr_msgint*)attr_hdr, msg_hdr, (uint8_t*)password, sizeof(password)-1)"
                     ,(int *)&gtest_ar_,(int *)&local_1a8);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar_);
            if (gtest_ar.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar10 = "";
            }
            else {
              pcVar10 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_1a8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                       ,0xd0,pcVar10);
            testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&gtest_ar_);
            testing::internal::AssertHelper::~AssertHelper(&local_1a8);
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&gtest_ar_);
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar.message_);
          psVar6 = stun_msg_next_attr((stun_msg_hdr *)expected_result,(stun_attr_hdr *)msgint);
          gtest_ar_._0_4_ = 0x8028;
          uVar1 = stun_attr_type(psVar6);
          local_1a8.data_._0_2_ = uVar1;
          testing::internal::CmpHelperEQ<stun_attr_type,unsigned_short>
                    ((internal *)&gtest_ar,"STUN_ATTR_FINGERPRINT","stun_attr_type(attr_hdr)",
                     (stun_attr_type *)&gtest_ar_,(unsigned_short *)&local_1a8);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar_);
            if (gtest_ar.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar10 = "";
            }
            else {
              pcVar10 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_1a8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                       ,0xd3,pcVar10);
            testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&gtest_ar_);
            testing::internal::AssertHelper::~AssertHelper(&local_1a8);
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&gtest_ar_);
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar.message_);
          psVar6 = stun_msg_next_attr((stun_msg_hdr *)expected_result,psVar6);
          testing::internal::EqHelper<true>::Compare<_stun_attr_hdr_const>
                    ((EqHelper<true> *)&gtest_ar,"__null","attr_hdr",(Secret *)0x0,psVar6);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar_);
            if (gtest_ar.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar10 = "";
            }
            else {
              pcVar10 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_1a8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                       ,0xd6,pcVar10);
            testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&gtest_ar_);
            testing::internal::AssertHelper::~AssertHelper(&local_1a8);
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&gtest_ar_);
          }
          goto LAB_0012651b;
        }
        testing::Message::Message((Message *)&gtest_ar_);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar10 = "";
        }
        else {
          pcVar10 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_1a8,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                   ,0xc9,pcVar10);
        testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&gtest_ar_);
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_1a8);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar_);
LAB_0012651b:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(StunMsg, RFC5769SampleRequest) {
  const char software_name[] = "STUN test client";
  const char username[] = "evtj:h6vY";
  const char password[] = "VOkJxbRl1RmTxUk/WvJxBt";

  const uint8_t expected_result[] = {
    0x00,0x01,0x00,0x58, //    Request type and message length
    0x21,0x12,0xa4,0x42, //    Magic cookie
    0xb7,0xe7,0xa7,0x01, // }
    0xbc,0x34,0xd6,0x86, // }  Transaction ID
    0xfa,0x87,0xdf,0xae, // }
    0x80,0x22,0x00,0x10, //    SOFTWARE attribute header
    0x53,0x54,0x55,0x4e, // }
    0x20,0x74,0x65,0x73, // }  User-agent...
    0x74,0x20,0x63,0x6c, // }  ...name
    0x69,0x65,0x6e,0x74, // }
    0x00,0x24,0x00,0x04, //    PRIORITY attribute header
    0x6e,0x00,0x01,0xff, //    ICE priority value
    0x80,0x29,0x00,0x08, //    ICE-CONTROLLED attribute header
    0x93,0x2f,0xf9,0xb1, // }  Pseudo-random tie breaker...
    0x51,0x26,0x3b,0x36, // }   ...for ICE control
    0x00,0x06,0x00,0x09, //    USERNAME attribute header
    0x65,0x76,0x74,0x6a, // }
    0x3a,0x68,0x36,0x76, // }  Username (9 bytes) and padding (3 bytes)
    0x59,0x20,0x20,0x20, // }
    0x00,0x08,0x00,0x14, //    MESSAGE-INTEGRITY attribute header
    0x9a,0xea,0xa7,0x0c, // }
    0xbf,0xd8,0xcb,0x56, // }
    0x78,0x1e,0xf2,0xb5, // }  HMAC-SHA1 fingerprint
    0xb2,0xd3,0xf2,0x49, // }
    0xc1,0xb5,0x71,0xa2, // }
    0x80,0x28,0x00,0x04, //    FINGERPRINT attribute header
    0xe5,0x7a,0x3b,0xcf, //    CRC0x32, fingerprint
  };

  uint8_t buffer[sizeof(stun_msg_hdr)
    + STUN_ATTR_VARSIZE_SIZE(sizeof(software_name) - 1)
    + STUN_ATTR_UINT32_SIZE
    + STUN_ATTR_UINT64_SIZE
    + STUN_ATTR_VARSIZE_SIZE(sizeof(username) - 1)
    + STUN_ATTR_MSGINT_SIZE
    + STUN_ATTR_FINGERPRINT_SIZE];

  uint8_t tsx_id[12] = {
    0xb7,0xe7,0xa7,0x01,
    0xbc,0x34,0xd6,0x86,
    0xfa,0x87,0xdf,0xae
  };

  ASSERT_EQ(sizeof(expected_result), sizeof(buffer));
  ASSERT_EQ(1, stun_msg_verify((stun_msg_hdr*)expected_result,
      sizeof(expected_result)));

  stun_msg_hdr *msg_hdr = (stun_msg_hdr *)buffer;
  stun_msg_hdr_init(msg_hdr, STUN_BINDING_REQUEST, tsx_id);  
  stun_attr_varsize_add(msg_hdr, STUN_ATTR_SOFTWARE, software_name,
        sizeof(software_name)-1, ' ');
  stun_attr_uint32_add(msg_hdr, STUN_ATTR_PRIORITY, 0x6e0001fful);
  stun_attr_uint64_add(msg_hdr, STUN_ATTR_ICE_CONTROLLED, 0x932ff9b151263b36ull);
  stun_attr_varsize_add(msg_hdr, STUN_ATTR_USERNAME, username,
        sizeof(username)-1, ' ');
  stun_attr_msgint_add(msg_hdr, password, sizeof(password)-1);
  stun_attr_fingerprint_add(msg_hdr);

  EXPECT_TRUE(IsEqual(expected_result, buffer,
      sizeof(expected_result)));

  // Now decoding
  msg_hdr = (stun_msg_hdr *)expected_result;
  EXPECT_EQ(STUN_BINDING_REQUEST, stun_msg_type(msg_hdr));
  EXPECT_EQ(sizeof(expected_result), stun_msg_len(msg_hdr));

  const stun_attr_hdr *attr_hdr = stun_msg_next_attr(msg_hdr, NULL);
  EXPECT_EQ(STUN_ATTR_SOFTWARE, stun_attr_type(attr_hdr));
  ASSERT_EQ(sizeof(software_name)-1, stun_attr_len(attr_hdr));
  const void* data = (uint8_t*)stun_attr_varsize_read(
    (stun_attr_varsize*)attr_hdr);
  EXPECT_TRUE(IsEqual(data, software_name, sizeof(software_name)-1));

  attr_hdr = stun_msg_next_attr(msg_hdr, attr_hdr);
  EXPECT_EQ(STUN_ATTR_PRIORITY, stun_attr_type(attr_hdr));
  EXPECT_EQ(0x6e0001fful, stun_attr_uint32_read((stun_attr_uint32*)attr_hdr));

  attr_hdr = stun_msg_next_attr(msg_hdr, attr_hdr);
  EXPECT_EQ(STUN_ATTR_ICE_CONTROLLED, stun_attr_type(attr_hdr));
  EXPECT_EQ(0x932ff9b151263b36ull,
      stun_attr_uint64_read((stun_attr_uint64*)attr_hdr));

  attr_hdr = stun_msg_next_attr(msg_hdr, attr_hdr);
  EXPECT_EQ(STUN_ATTR_USERNAME, stun_attr_type(attr_hdr));
  ASSERT_EQ(sizeof(username)-1, stun_attr_len(attr_hdr));
  data = stun_attr_varsize_read((stun_attr_varsize*)attr_hdr);
  EXPECT_TRUE(IsEqual(data, username, sizeof(username)-1));

  attr_hdr = stun_msg_next_attr(msg_hdr, attr_hdr);
  EXPECT_EQ(STUN_ATTR_MESSAGE_INTEGRITY, stun_attr_type(attr_hdr));
  EXPECT_EQ(1, stun_attr_msgint_check((stun_attr_msgint*)attr_hdr, msg_hdr,
      (uint8_t*)password, sizeof(password)-1));

  attr_hdr = stun_msg_next_attr(msg_hdr, attr_hdr);
  EXPECT_EQ(STUN_ATTR_FINGERPRINT, stun_attr_type(attr_hdr));

  attr_hdr = stun_msg_next_attr(msg_hdr, attr_hdr);
  EXPECT_EQ(NULL, attr_hdr);
}